

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

void f_noncentral_cdf_values(int *n_data,int *n1,int *n2,double *lambda,double *x,double *fx)

{
  int iVar1;
  long lVar2;
  double dVar3;
  
  if (*n_data < 0) {
    *n_data = 0;
  }
  iVar1 = *n_data;
  *n_data = iVar1 + 1;
  if ((long)iVar1 < 0x16) {
    *n1 = f_noncentral_cdf_values::n1_vec[iVar1];
    *n2 = *(int *)(&DAT_0021e3fc + (long)*n_data * 4);
    lVar2 = (long)*n_data;
    *lambda = f_noncentral_cdf_values::fx_vec[lVar2 + 0x15];
    *x = *(double *)(&DAT_0021e458 + lVar2 * 8);
    dVar3 = f_cdf_values::x_vec[lVar2 + 0x13];
  }
  else {
    *n_data = 0;
    *n1 = 0;
    *n2 = 0;
    *lambda = 0.0;
    *x = 0.0;
    dVar3 = 0.0;
  }
  *fx = dVar3;
  return;
}

Assistant:

void f_noncentral_cdf_values ( int &n_data, int &n1, int &n2, double &lambda,
  double &x, double &fx )

//****************************************************************************80
//
//  Purpose:
//
//    F_NONCENTRAL_CDF_VALUES returns some values of the F CDF test function.
//
//  Discussion:
//
//    In Mathematica, the function can be evaluated by:
//
//      Needs["Statistics`ContinuousDistributions`"]
//      dist = NoncentralFRatioDistribution [ n1, n2, lambda ]
//      CDF [ dist, x ]
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    30 August 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//    Stephen Wolfram,
//    The Mathematica Book,
//    Fourth Edition,
//    Cambridge University Press, 1999,
//    ISBN: 0-521-64314-7,
//    LC: QA76.95.W65.
//
//  Parameters:
//
//    Input/output, int &N_DATA.  The user sets N_DATA to 0 before the
//    first call.  On each call, the routine increments N_DATA by 1, and
//    returns the corresponding data; when there is no more data, the
//    output value of N_DATA will be 0 again.
//
//    Output, int &N1, int &N2, the numerator and denominator
//    degrees of freedom.
//
//    Output, double &LAMBDA, the noncentrality parameter.
//
//    Output, double &X, the argument of the function.
//
//    Output, double &FX, the value of the function.
//
{
# define N_MAX 22

  static double fx_vec[N_MAX] = {
     0.5000000000000000E+00,
     0.6367825323508774E+00,
     0.5840916116305482E+00,
     0.3234431872392788E+00,
     0.4501187879813550E+00,
     0.6078881441188312E+00,
     0.7059275551414605E+00,
     0.7721782003263727E+00,
     0.8191049017635072E+00,
     0.3170348430749965E+00,
     0.4327218008454471E+00,
     0.4502696915707327E+00,
     0.4261881186594096E+00,
     0.6753687206341544E+00,
     0.4229108778879005E+00,
     0.6927667261228938E+00,
     0.3632174676491226E+00,
     0.4210054012695865E+00,
     0.4266672258818927E+00,
     0.4464016600524644E+00,
     0.8445888579504827E+00,
     0.4339300273343604E+00 };

  static double lambda_vec[N_MAX] = {
     0.00E+00,
     0.00E+00,
     0.25E+00,
     1.00E+00,
     1.00E+00,
     1.00E+00,
     1.00E+00,
     1.00E+00,
     1.00E+00,
     2.00E+00,
     1.00E+00,
     1.00E+00,
     1.00E+00,
     2.00E+00,
     1.00E+00,
     1.00E+00,
     0.00E+00,
     1.00E+00,
     1.00E+00,
     1.00E+00,
     1.00E+00,
     1.00E+00 };

  static int n1_vec[N_MAX] = {
     1,  1,  1,  1,
     1,  1,  1,  1,
     1,  1,  2,  2,
     3,  3,  4,  4,
     5,  5,  6,  6,
     8, 16 };

  static int n2_vec[N_MAX] = {
     1,  5,  5,  5,
     5,  5,  5,  5,
     5,  5,  5, 10,
     5,  5,  5,  5,
     1,  5,  6, 12,
    16,  8 };

  static double x_vec[N_MAX] = {
     1.00E+00,
     1.00E+00,
     1.00E+00,
     0.50E+00,
     1.00E+00,
     2.00E+00,
     3.00E+00,
     4.00E+00,
     5.00E+00,
     1.00E+00,
     1.00E+00,
     1.00E+00,
     1.00E+00,
     1.00E+00,
     1.00E+00,
     2.00E+00,
     1.00E+00,
     1.00E+00,
     1.00E+00,
     1.00E+00,
     2.00E+00,
     2.00E+00 };

  if ( n_data < 0 )
  {
    n_data = 0;
  }

  n_data = n_data + 1;

  if ( N_MAX < n_data )
  {
    n_data = 0;
    n1 = 0;
    n2 = 0;
    lambda = 0.0;
    x = 0.0;
    fx = 0.0;
  }
  else
  {
    n1 = n1_vec[n_data-1];
    n2 = n2_vec[n_data-1];
    lambda = lambda_vec[n_data-1];
    x = x_vec[n_data-1];
    fx = fx_vec[n_data-1];
  }

  return;
# undef N_MAX
}